

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks.c
# Opt level: O0

CURLcode socks_proxy_cf_connect(Curl_cfilter *cf,Curl_easy *data,_Bool blocking,_Bool *done)

{
  int iVar1;
  connectdata *conn_00;
  uint local_74;
  uint local_70;
  uint local_6c;
  char *local_68;
  char *local_60;
  char *local_58;
  socks_state *local_50;
  socks_state *sx;
  int sockindex;
  connectdata *conn;
  CURLcode result;
  _Bool *done_local;
  _Bool blocking_local;
  Curl_easy *data_local;
  Curl_cfilter *cf_local;
  
  conn_00 = cf->conn;
  iVar1 = cf->sockindex;
  local_50 = (socks_state *)cf->ctx;
  if ((cf->field_0x24 & 1) == 0) {
    cf_local._4_4_ = (*cf->next->cft->do_connect)(cf->next,data,blocking,done);
    if ((cf_local._4_4_ == CURLE_OK) && ((*done & 1U) != 0)) {
      if (local_50 == (socks_state *)0x0) {
        local_50 = (socks_state *)(*Curl_ccalloc)(1,0x290);
        if (local_50 == (socks_state *)0x0) {
          return CURLE_OUT_OF_MEMORY;
        }
        cf->ctx = local_50;
      }
      if (local_50->state == CONNECT_INIT) {
        socksstate(local_50,data,CONNECT_SOCKS_INIT);
        if (((ulong)conn_00->bits & 1) == 0) {
          if (((ulong)conn_00->bits >> 8 & 1) == 0) {
            if (iVar1 == 1) {
              local_68 = conn_00->secondaryhostname;
            }
            else {
              local_68 = (conn_00->host).name;
            }
            local_60 = local_68;
          }
          else {
            local_60 = (conn_00->conn_to_host).name;
          }
          local_58 = local_60;
        }
        else {
          local_58 = (conn_00->http_proxy).host.name;
        }
        local_50->hostname = local_58;
        if (((ulong)conn_00->bits & 1) == 0) {
          if (iVar1 == 1) {
            local_70 = (uint)conn_00->secondary_port;
          }
          else {
            if (((ulong)conn_00->bits >> 9 & 1) == 0) {
              local_74 = conn_00->remote_port;
            }
            else {
              local_74 = conn_00->conn_to_port;
            }
            local_70 = local_74;
          }
          local_6c = local_70;
        }
        else {
          local_6c = (conn_00->http_proxy).port;
        }
        local_50->remote_port = local_6c;
        local_50->proxy_user = (conn_00->socks_proxy).user;
        local_50->proxy_password = (conn_00->socks_proxy).passwd;
      }
      cf_local._4_4_ = connect_SOCKS(cf,local_50,data);
      if ((cf_local._4_4_ == CURLE_OK) && (local_50->state == CONNECT_DONE)) {
        cf->field_0x24 = cf->field_0x24 & 0xfe | 1;
        Curl_verboseconnect(data,conn_00,cf->sockindex);
        socks_proxy_cf_free(cf);
      }
      *done = (cf->field_0x24 & 1) != 0;
    }
  }
  else {
    *done = true;
    cf_local._4_4_ = CURLE_OK;
  }
  return cf_local._4_4_;
}

Assistant:

static CURLcode socks_proxy_cf_connect(struct Curl_cfilter *cf,
                                       struct Curl_easy *data,
                                       bool blocking, bool *done)
{
  CURLcode result;
  struct connectdata *conn = cf->conn;
  int sockindex = cf->sockindex;
  struct socks_state *sx = cf->ctx;

  if(cf->connected) {
    *done = TRUE;
    return CURLE_OK;
  }

  result = cf->next->cft->do_connect(cf->next, data, blocking, done);
  if(result || !*done)
    return result;

  if(!sx) {
    sx = calloc(1, sizeof(*sx));
    if(!sx)
      return CURLE_OUT_OF_MEMORY;
    cf->ctx = sx;
  }

  if(sx->state == CONNECT_INIT) {
    /* for the secondary socket (FTP), use the "connect to host"
     * but ignore the "connect to port" (use the secondary port)
     */
    sxstate(sx, data, CONNECT_SOCKS_INIT);
    sx->hostname =
      conn->bits.httpproxy ?
      conn->http_proxy.host.name :
      conn->bits.conn_to_host ?
      conn->conn_to_host.name :
      sockindex == SECONDARYSOCKET ?
      conn->secondaryhostname : conn->host.name;
    sx->remote_port =
      conn->bits.httpproxy ? (int)conn->http_proxy.port :
      sockindex == SECONDARYSOCKET ? conn->secondary_port :
      conn->bits.conn_to_port ? conn->conn_to_port :
      conn->remote_port;
    sx->proxy_user = conn->socks_proxy.user;
    sx->proxy_password = conn->socks_proxy.passwd;
  }

  result = connect_SOCKS(cf, sx, data);
  if(!result && sx->state == CONNECT_DONE) {
    cf->connected = TRUE;
    Curl_verboseconnect(data, conn, cf->sockindex);
    socks_proxy_cf_free(cf);
  }

  *done = cf->connected;
  return result;
}